

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O3

TestCaseGroup * vkt::tessellation::createMiscDrawTests(TestContext *testCtx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  undefined8 uVar9;
  CaseDefinition *in_R9;
  int iVar10;
  string caseName;
  CaseDefinition caseDef_2;
  CaseDefinition caseDef_1;
  CaseDefinition caseDef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  uint local_e0;
  ShaderType local_dc;
  TestCaseGroup *local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  long local_b0;
  undefined4 local_a8;
  int local_a4;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  ShaderType local_80;
  int local_7c;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  ShaderType local_58;
  int local_54;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_d8 = (TestCaseGroup *)operator_new(0x70);
  pcVar5 = "Miscellaneous draw-result-verifying cases";
  tcu::TestCaseGroup::TestCaseGroup
            (local_d8,testCtx,"misc_draw","Miscellaneous draw-result-verifying cases");
  paVar1 = &local_120.field_2;
  uVar9 = CONCAT71((int7)((ulong)pcVar5 >> 8),1);
  lVar3 = 0;
  do {
    local_e0 = (uint)uVar9;
    local_dc = createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[lVar3];
    local_b0 = (long)(int)local_dc;
    iVar10 = 0;
    do {
      local_d0 = &local_c0;
      local_c8 = 0;
      local_c0 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_130 = *plVar6;
        lStack_128 = plVar2[3];
        local_140 = &local_130;
      }
      else {
        local_130 = *plVar6;
        local_140 = (long *)*plVar2;
      }
      local_138 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar7 = (ulong *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_120.field_2._M_allocated_capacity = *puVar7;
        local_120.field_2._8_8_ = plVar2[3];
        local_120._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_120.field_2._M_allocated_capacity = *puVar7;
        local_120._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_120._M_string_length = plVar2[1];
      *plVar2 = (long)puVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      psVar8 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_160.field_2._M_allocated_capacity = *psVar8;
        local_160.field_2._8_8_ = plVar2[3];
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar8;
        local_160._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_160._M_string_length = plVar2[1];
      *plVar2 = (long)psVar8;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_160);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      psVar8 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_100.field_2._M_allocated_capacity = *psVar8;
        local_100.field_2._8_8_ = plVar2[3];
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar8;
        local_100._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_100._M_string_length = plVar2[1];
      *plVar2 = (long)psVar8;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar1) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
      local_120._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,
                 "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape"
                 ,"");
      std::operator+(&local_160,"vulkan/data/tessellation/",&local_100);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_160);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_130 = *plVar6;
        lStack_128 = plVar2[3];
        local_140 = &local_130;
      }
      else {
        local_130 = *plVar6;
        local_140 = (long *)*plVar2;
      }
      local_138 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      local_50 = &local_40;
      local_48 = 0;
      local_40 = 0;
      local_58 = local_dc;
      local_54 = iVar10;
      std::__cxx11::string::_M_assign((string *)&local_50);
      addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
                (local_d8,&local_100,&local_120,anon_unknown_2::initProgramsFillCoverCase,
                 (Function)&local_58,in_R9);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar1) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != 3);
    lVar3 = 1;
    uVar9 = 0;
  } while ((local_e0 & 1) != 0);
  uVar4 = 1;
  lVar3 = 0;
  do {
    local_dc = createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[lVar3];
    local_b0 = (long)(int)local_dc;
    iVar10 = 0;
    local_e0 = uVar4;
    do {
      local_d0 = &local_c0;
      local_c8 = 0;
      local_c0 = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_130 = *plVar6;
        lStack_128 = plVar2[3];
        local_140 = &local_130;
      }
      else {
        local_130 = *plVar6;
        local_140 = (long *)*plVar2;
      }
      local_138 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar7 = (ulong *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_120.field_2._M_allocated_capacity = *puVar7;
        local_120.field_2._8_8_ = plVar2[3];
        local_120._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_120.field_2._M_allocated_capacity = *puVar7;
        local_120._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_120._M_string_length = plVar2[1];
      *plVar2 = (long)puVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      psVar8 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_160.field_2._M_allocated_capacity = *psVar8;
        local_160.field_2._8_8_ = plVar2[3];
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar8;
        local_160._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_160._M_string_length = plVar2[1];
      *plVar2 = (long)psVar8;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_160);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      psVar8 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_100.field_2._M_allocated_capacity = *psVar8;
        local_100.field_2._8_8_ = plVar2[3];
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar8;
        local_100._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_100._M_string_length = plVar2[1];
      *plVar2 = (long)psVar8;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar1) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
      local_120._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,
                 "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape"
                 ,"");
      std::operator+(&local_160,"vulkan/data/tessellation/",&local_100);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_160);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_130 = *plVar6;
        lStack_128 = plVar2[3];
        local_140 = &local_130;
      }
      else {
        local_130 = *plVar6;
        local_140 = (long *)*plVar2;
      }
      local_138 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      local_78 = &local_68;
      local_70 = 0;
      local_68 = 0;
      local_80 = local_dc;
      local_7c = iVar10;
      std::__cxx11::string::_M_assign((string *)&local_78);
      addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
                (local_d8,&local_100,&local_120,anon_unknown_2::initProgramsFillNonOverlapCase,
                 (Function)&local_80,in_R9);
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar1) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != 3);
    lVar3 = 1;
    iVar10 = 0;
    uVar4 = 0;
  } while ((local_e0 & 1) != 0);
  do {
    local_120._M_string_length = 0;
    local_120.field_2._M_allocated_capacity =
         local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_120._M_dataplus._M_p = (pointer)paVar1;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    psVar8 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_160.field_2._M_allocated_capacity = *psVar8;
      local_160.field_2._8_8_ = plVar2[3];
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar8;
      local_160._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_160._M_string_length = plVar2[1];
    *plVar2 = (long)psVar8;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_160);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    psVar8 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_100.field_2._M_allocated_capacity = *psVar8;
      local_100.field_2._8_8_ = plVar2[3];
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar8;
      local_100._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_100._M_string_length = plVar2[1];
    *plVar2 = (long)psVar8;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    local_120._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Basic isolines render test","");
    std::operator+(&local_160,"vulkan/data/tessellation/",&local_100);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_130 = *plVar6;
      lStack_128 = plVar2[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar6;
      local_140 = (long *)*plVar2;
    }
    local_138 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    local_a0 = &local_90;
    local_98 = 0;
    local_90 = 0;
    local_a8 = 2;
    local_a4 = iVar10;
    std::__cxx11::string::_M_assign((string *)&local_a0);
    addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
              (local_d8,&local_100,&local_120,anon_unknown_2::initProgramsIsolinesCase,
               (Function)&local_a8,in_R9);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != 3);
  return local_d8;
}

Assistant:

tcu::TestCaseGroup* createMiscDrawTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "misc_draw", "Miscellaneous draw-result-verifying cases"));

	static const TessPrimitiveType primitivesNoIsolines[] =
	{
		TESSPRIMITIVETYPE_TRIANGLES,
		TESSPRIMITIVETYPE_QUADS,
	};

	// Triangle fill case
	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitivesNoIsolines); ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitivesNoIsolines[primitiveTypeNdx];
		const SpacingMode		spacingMode	  = static_cast<SpacingMode>(spacingModeNdx);
		const std::string		caseName	  = std::string() + "fill_cover_" + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape",
									initProgramsFillCoverCase, runTest, makeCaseDefinition(primitiveType, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	// Triangle non-overlap case
	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitivesNoIsolines); ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitivesNoIsolines[primitiveTypeNdx];
		const SpacingMode		spacingMode	  = static_cast<SpacingMode>(spacingModeNdx);
		const std::string		caseName	  = std::string() + "fill_overlap_" + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape",
									initProgramsFillNonOverlapCase, runTest, makeCaseDefinition(primitiveType, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	// Isolines
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const SpacingMode spacingMode = static_cast<SpacingMode>(spacingModeNdx);
		const std::string caseName    = std::string() + "isolines_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Basic isolines render test",
									initProgramsIsolinesCase, runTest, makeCaseDefinition(TESSPRIMITIVETYPE_ISOLINES, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	return group.release();
}